

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

void pstore::database::build_new_store(file_base *file)

{
  atomic<pstore::typed_address<pstore::trailer>_> aVar1;
  uint32_t uVar2;
  int iVar3;
  typed_address<pstore::trailer> tVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  lock_block lb;
  header header;
  not_null<const_void_*> local_d0;
  trailer local_c8;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [40];
  atomic<pstore::typed_address<pstore::trailer>_> local_20;
  undefined4 extraout_var;
  
  (*file->_vptr_file_base[6])(file,0);
  pstore::header::header((header *)local_48);
  LOCK();
  local_20._M_i.a_.a_ = (typed_address<pstore::trailer>)(address)0x40;
  UNLOCK();
  local_c8.a.signature1._M_elems = (_Type)local_48;
  gsl::not_null<const_void_*>::ensure_invariant((not_null<const_void_*> *)&local_c8);
  (*file->_vptr_file_base[0xe])(file,local_c8.a.signature1._M_elems,0x30);
  local_c8.a.signature1._M_elems = (_Type)&local_58;
  local_58 = 0x6b4c6d7575636156;
  local_50 = 0x4c746361736e7254;
  gsl::not_null<const_void_*>::ensure_invariant((not_null<const_void_*> *)&local_c8);
  (*file->_vptr_file_base[0xe])(file,local_c8.a.signature1._M_elems,0x10);
  aVar1._M_i.a_.a_ = local_20._M_i.a_.a_;
  tVar4.a_.a_._0_4_ = (*file->_vptr_file_base[7])(file);
  tVar4.a_.a_._4_4_ = extraout_var;
  if (aVar1._M_i.a_.a_ != (typed_address<pstore::trailer>)tVar4.a_.a_) {
    assert_failed("header.footer_pos.load () == typed_address<trailer>::make (file.tell ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                  ,0xea);
  }
  builtin_memcpy(local_c8.a.signature1._M_elems,"hPPyfooT",8);
  local_c8.a.generation.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0x0;
  local_c8.a.unused1 = 0;
  local_c8.a.size.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_c8.a.time.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_c8.a.prev_generation.a_.a_ = (address)0;
  local_c8.a.unused2 = 0;
  local_c8.a.unused3 = 0;
  local_c8.crc = 0;
  local_c8.unused1 = 0;
  builtin_memcpy(local_c8.signature2._M_elems,"hPPyTail",8);
  local_c8.a.index_records._M_elems[0].a_.a_ = (address)0;
  local_c8.a.index_records._M_elems[1].a_.a_ = (address)0;
  local_c8.a.index_records._M_elems[2].a_.a_ = (address)0;
  local_c8.a.index_records._M_elems[3].a_.a_ = (address)0;
  local_c8.a.index_records._M_elems[4].a_.a_ = (address)0;
  local_c8.a.index_records._M_elems[5].a_.a_ = (address)0;
  local_c8.a.time.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)milliseconds_since_epoch();
  LOCK();
  UNLOCK();
  uVar2 = trailer::get_crc(&local_c8);
  local_c8.crc = uVar2;
  local_d0.ptr_ = &local_c8;
  gsl::not_null<const_void_*>::ensure_invariant(&local_d0);
  (*file->_vptr_file_base[0xe])(file,local_d0.ptr_,0x70);
  iVar3 = (*file->_vptr_file_base[9])(file);
  if (CONCAT44(extraout_var_00,iVar3) == 0xb0) {
    iVar3 = (*file->_vptr_file_base[9])(file);
    if (CONCAT44(extraout_var_01,iVar3) < 0x400000) {
      (*file->_vptr_file_base[10])(file,0x400000);
    }
    return;
  }
  assert_failed("file.size () == leader_size + sizeof (trailer)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0xf5);
}

Assistant:

void database::build_new_store (file::file_base & file) {
        // Write the inital header, lock block, and footer to the file.
        {
            file.seek (0);

            header header{};
            header.footer_pos = typed_address<trailer>::make (leader_size);
            file.write (header);

            lock_block const lb{};
            file.write (lb);

            PSTORE_ASSERT (header.footer_pos.load () ==
                           typed_address<trailer>::make (file.tell ()));

            trailer t{};
            std::fill (std::begin (t.a.index_records), std::end (t.a.index_records),
                       typed_address<index::header_block>::null ());
            t.a.time = milliseconds_since_epoch ();
            t.crc = t.get_crc ();
            file.write (t);
        }
        // Make sure that the file is at least large enough for the minimum region size.
        {
            PSTORE_ASSERT (file.size () == leader_size + sizeof (trailer));
            // TODO: ask the region factory what the min region size is.
            if (file.size () < storage::min_region_size && !database::small_files_enabled ()) {
                file.truncate (storage::min_region_size);
            }
        }
    }